

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_test.cpp
# Opt level: O1

void __thiscall
shared_ptr_dyn_pointer_cast_Test::~shared_ptr_dyn_pointer_cast_Test
          (shared_ptr_dyn_pointer_cast_Test *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  testing::Test::~Test(&this->super_Test);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0x10);
    return;
  }
  __stack_chk_fail();
}

Assistant:

TEST(shared_ptr, dyn_pointer_cast)
{
   shared_ptr<A> a0Ptr;
   EXPECT_EQ(false, a0Ptr);

   {
      shared_ptr<A> aPtr(new A);
      EXPECT_EQ(true, aPtr);
      EXPECT_EQ(true, aPtr.unique());
      EXPECT_EQ(1, aPtr.use_count());
      EXPECT_NE((void*)NULL, aPtr.get());
      EXPECT_EQ(1, A::_mNbInstances);

      shared_ptr<A> abPtr(new B);
      EXPECT_EQ(true, abPtr);
      EXPECT_EQ(true, abPtr.unique());
      EXPECT_EQ(1, abPtr.use_count());
      EXPECT_NE((void*)NULL, abPtr.get());
      EXPECT_EQ(2, A::_mNbInstances);
      EXPECT_EQ(1, B::_mNbInstances);

      shared_ptr<B> bPtr(new B);
      EXPECT_EQ(true, bPtr);
      EXPECT_EQ(true, bPtr.unique());
      EXPECT_EQ(1, bPtr.use_count());
      EXPECT_NE((void*)NULL, bPtr.get());
      EXPECT_EQ(3, A::_mNbInstances);
      EXPECT_EQ(2, B::_mNbInstances);

      // dynamic cast
      shared_ptr<A> a2Ptr = dynamic_pointer_cast<A>(bPtr);
      EXPECT_EQ(true, a2Ptr);
      EXPECT_EQ(false, a2Ptr.unique());
      EXPECT_EQ(2, a2Ptr.use_count());
      EXPECT_NE((void*)NULL, a2Ptr.get());
      EXPECT_EQ(3, A::_mNbInstances);
      EXPECT_EQ(2, B::_mNbInstances);

      // memorize a2Ptr
      a0Ptr = a2Ptr;
      EXPECT_EQ(3, a0Ptr.use_count());
   }
   // after release of the aPtr and bPtr : only abPtr converted to a2Ptr survived through a0Ptr
   EXPECT_EQ(true, a0Ptr);
   EXPECT_EQ(true, a0Ptr.unique());
   EXPECT_EQ(1, a0Ptr.use_count());
   EXPECT_NE((void*)NULL, a0Ptr.get());
   EXPECT_EQ(1, A::_mNbInstances);
   EXPECT_EQ(1, B::_mNbInstances);

   // release the last one
   a0Ptr.reset();
   EXPECT_EQ(false, a0Ptr);
   EXPECT_EQ(false, a0Ptr.unique());
   EXPECT_EQ(0,     a0Ptr.use_count());
   EXPECT_EQ((void*)NULL,  a0Ptr.get());
   EXPECT_EQ(0,     A::_mNbInstances);
   EXPECT_EQ(0,     B::_mNbInstances);
}